

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,KOCTET *Data,KUINT8 Length)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator __position;
  KUINT16 KVar3;
  pointer pcVar4;
  ulong uVar5;
  
  pcVar2 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  KVar3 = ((short)pcVar2 - (short)pcVar4) +
          (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar3;
  if (pcVar2 != pcVar4) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    pcVar4 = pcVar2;
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 0x40) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 0x40;
    KVar3 = KVar3 + 1;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar3;
  }
  if (pcVar4 != pcVar2) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  uVar5 = (ulong)Length;
  if (Length != '\0') {
    do {
      __position._M_current =
           (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&this->m_vSSD,__position,Data);
      }
      else {
        *__position._M_current = *Data;
        ppcVar1 = &(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      Data = Data + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    KVar3 = (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  }
  this->m_ui8SSDLen = Length;
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar3 + Length;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const KOCTET * Data, KUINT8 Length )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD.clear();

    for( KUINT8 i = 0; i < Length; ++i )
    {
        m_vSSD.push_back( Data[i] );
    }

    m_ui8SSDLen = Length;

    // Set the new pdu length
    m_ui16PDULength += Length;
}